

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoIP.c
# Opt level: O0

GeoIPRegion * GeoIP_region_by_addr(GeoIP *gi,char *addr)

{
  unsigned_long ipnum_00;
  unsigned_long ipnum;
  char *addr_local;
  GeoIP *gi_local;
  
  if (addr == (char *)0x0) {
    gi_local = (GeoIP *)0x0;
  }
  else if ((gi->databaseType == '\a') || (gi->databaseType == '\x03')) {
    ipnum_00 = _GeoIP_addr_to_num(addr);
    gi_local = (GeoIP *)_get_region(gi,ipnum_00);
  }
  else {
    printf("Invalid database type %s, expected %s\n",GeoIPDBDescription[(int)gi->databaseType],
           GeoIPDBDescription[3]);
    gi_local = (GeoIP *)0x0;
  }
  return (GeoIPRegion *)gi_local;
}

Assistant:

GeoIPRegion * GeoIP_region_by_addr (GeoIP* gi, const char *addr) {
	unsigned long ipnum;
	if (addr == NULL) {
		return 0;
	}
	if (gi->databaseType != GEOIP_REGION_EDITION_REV0 &&
			gi->databaseType != GEOIP_REGION_EDITION_REV1) {
		printf("Invalid database type %s, expected %s\n", GeoIPDBDescription[(int)gi->databaseType], GeoIPDBDescription[GEOIP_REGION_EDITION_REV1]);
		return 0;
	}
	ipnum = _GeoIP_addr_to_num(addr);
	return _get_region(gi, ipnum);
}